

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void ddst(int n,int isgn,double *a,int *ip,double *w)

{
  double dVar1;
  double dVar2;
  double xr;
  int local_30;
  int nc;
  int nw;
  int j;
  double *w_local;
  int *ip_local;
  double *a_local;
  int isgn_local;
  int n_local;
  
  local_30 = *ip;
  if (local_30 * 4 < n) {
    local_30 = n >> 2;
    makewt(local_30,ip,w);
  }
  xr._4_4_ = ip[1];
  if (xr._4_4_ < n) {
    makect(n,ip,w + local_30);
    xr._4_4_ = n;
  }
  if (isgn < 0) {
    dVar1 = a[n + -1];
    for (nc = n + -2; 1 < nc; nc = nc + -2) {
      a[nc + 1] = -a[nc] - a[nc + -1];
      a[nc] = a[nc] - a[nc + -1];
    }
    a[1] = *a + dVar1;
    *a = *a - dVar1;
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      rftbsub(n,a,xr._4_4_,w + local_30);
      bitrv2(n,ip + 2,a);
      cftbsub(n,a,w);
    }
  }
  dstsub(n,a,xr._4_4_,w + local_30);
  if (-1 < isgn) {
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(n,ip + 2,a);
      cftfsub(n,a,w);
      rftfsub(n,a,xr._4_4_,w + local_30);
    }
    dVar1 = *a;
    dVar2 = a[1];
    *a = a[1] + *a;
    for (nc = 2; nc < n; nc = nc + 2) {
      a[nc + -1] = -a[nc] - a[nc + 1];
      a[nc] = a[nc] - a[nc + 1];
    }
    a[n + -1] = -(dVar1 - dVar2);
  }
  return;
}

Assistant:

void ddst(int n, int isgn, double *a, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void makect(int nc, int *ip, double *c);
    void bitrv2(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void cftbsub(int n, double *a, double *w);
    void rftfsub(int n, double *a, int nc, double *c);
    void rftbsub(int n, double *a, int nc, double *c);
    void dstsub(int n, double *a, int nc, double *c);
    int j, nw, nc;
    double xr;
    
    nw = ip[0];
    if (n > (nw << 2)) {
        nw = n >> 2;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > nc) {
        nc = n;
        makect(nc, ip, w + nw);
    }
    if (isgn < 0) {
        xr = a[n - 1];
        for (j = n - 2; j >= 2; j -= 2) {
            a[j + 1] = -a[j] - a[j - 1];
            a[j] -= a[j - 1];
        }
        a[1] = a[0] + xr;
        a[0] -= xr;
        if (n > 4) {
            rftbsub(n, a, nc, w + nw);
            bitrv2(n, ip + 2, a);
            cftbsub(n, a, w);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
    }
    dstsub(n, a, nc, w + nw);
    if (isgn >= 0) {
        if (n > 4) {
            bitrv2(n, ip + 2, a);
            cftfsub(n, a, w);
            rftfsub(n, a, nc, w + nw);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
        xr = a[0] - a[1];
        a[0] += a[1];
        for (j = 2; j < n; j += 2) {
            a[j - 1] = -a[j] - a[j + 1];
            a[j] -= a[j + 1];
        }
        a[n - 1] = -xr;
    }
}